

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int32 bio_fwrite(void *buf,int32 el_sz,int32 n_el,FILE *fp,int32 swap,uint32 *chksum)

{
  uint32 uVar1;
  int32 iVar2;
  void *__dest;
  size_t sVar3;
  
  if (chksum != (uint32 *)0x0) {
    uVar1 = chksum_accum(buf,el_sz,n_el,*chksum);
    *chksum = uVar1;
  }
  if (swap == 0) {
    sVar3 = fwrite(buf,(long)el_sz,(long)n_el,(FILE *)fp);
    iVar2 = (int32)sVar3;
  }
  else {
    __dest = __ckd_calloc__((long)n_el,(long)el_sz,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                            ,0x15f);
    memcpy(__dest,buf,(long)(n_el * el_sz));
    swap_buf(__dest,el_sz,n_el);
    sVar3 = fwrite(__dest,(long)el_sz,(long)n_el,(FILE *)fp);
    iVar2 = (int32)sVar3;
    ckd_free(__dest);
  }
  return iVar2;
}

Assistant:

int32
bio_fwrite(const void *buf, int32 el_sz, int32 n_el, FILE *fp,
           int32 swap, uint32 *chksum)
{
    if (chksum)
        *chksum = chksum_accum(buf, el_sz, n_el, *chksum);
    if (swap) {
        void *nbuf;
        int rv;

        nbuf = ckd_calloc(n_el, el_sz);
        memcpy(nbuf, buf, n_el * el_sz);
        swap_buf(nbuf, el_sz, n_el);
        rv = fwrite(nbuf, el_sz, n_el, fp);
        ckd_free(nbuf);
        return rv;
    }
    else {
        return fwrite(buf, el_sz, n_el, fp);
    }
}